

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

ParseStatus
duckdb_re2::ParseUnicodeGroup
          (StringPiece *s,ParseFlags parse_flags,CharClassBuilder *cc,RegexpStatus *status)

{
  bool bVar1;
  ParseFlags PVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pcVar6;
  const_pointer pcVar7;
  const_pointer pcVar8;
  StringPiece *name_00;
  const_pointer pcVar9;
  UGroup *pUVar10;
  RegexpStatus *in_RCX;
  ParseFlags in_ESI;
  StringPiece *in_RDI;
  UGroup *g;
  size_t end;
  char *p;
  StringPiece name;
  StringPiece seq;
  int sign;
  Rune c;
  size_type in_stack_ffffffffffffff58;
  RegexpStatus *in_stack_ffffffffffffff60;
  StringPiece *in_stack_ffffffffffffff68;
  StringPiece local_90;
  Rune *local_80;
  RegexpStatus *in_stack_ffffffffffffff88;
  StringPiece *in_stack_ffffffffffffff90;
  Rune *in_stack_ffffffffffffff98;
  StringPiece local_50;
  int iVar11;
  ParseStatus local_4;
  
  PVar2 = operator&(in_ESI,UnicodeGroups);
  if (PVar2 == NoParseFlags) {
    local_4 = kParseNothing;
  }
  else {
    sVar5 = StringPiece::size(in_RDI);
    if ((sVar5 < 2) || (pcVar6 = StringPiece::operator[](in_RDI,0), *pcVar6 != '\\')) {
      local_4 = kParseNothing;
    }
    else {
      pcVar6 = StringPiece::operator[](in_RDI,1);
      iVar3 = (int)*pcVar6;
      if ((iVar3 == 0x70) || (iVar3 == 0x50)) {
        iVar11 = 1;
        if (iVar3 == 0x50) {
          iVar11 = -1;
        }
        StringPiece::StringPiece(&local_50);
        StringPiece::remove_prefix(in_RDI,2);
        iVar4 = StringPieceToRune(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                  in_stack_ffffffffffffff88);
        if (iVar4 == 0) {
          local_4 = kParseError;
        }
        else {
          if (iVar3 == 0x7b) {
            sVar5 = StringPiece::find(in_stack_ffffffffffffff68,
                                      (char)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                                      in_stack_ffffffffffffff58);
            if (sVar5 == 0xffffffffffffffff) {
              bVar1 = IsValidUTF8(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
              if (!bVar1) {
                return kParseError;
              }
              RegexpStatus::set_code(in_RCX,kRegexpBadCharRange);
              RegexpStatus::set_error_arg(in_RCX,(StringPiece *)&stack0xffffffffffffffc0);
              return kParseError;
            }
            pcVar9 = StringPiece::data(in_RDI);
            StringPiece::StringPiece((StringPiece *)&local_80,pcVar9,sVar5);
            local_50.data_ = (const_pointer)local_80;
            StringPiece::remove_prefix(in_RDI,sVar5 + 1);
            bVar1 = IsValidUTF8(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
            if (!bVar1) {
              return kParseError;
            }
          }
          else {
            pcVar7 = StringPiece::data((StringPiece *)&stack0xffffffffffffffc0);
            pcVar9 = pcVar7 + 2;
            pcVar8 = StringPiece::data(in_RDI);
            StringPiece::StringPiece
                      ((StringPiece *)&stack0xffffffffffffff98,pcVar9,
                       (long)pcVar8 - (long)(pcVar7 + 2));
            local_50.data_ = (const_pointer)in_stack_ffffffffffffff98;
          }
          name_00 = (StringPiece *)StringPiece::data((StringPiece *)&stack0xffffffffffffffc0);
          pcVar9 = StringPiece::data(in_RDI);
          pcVar7 = StringPiece::data((StringPiece *)&stack0xffffffffffffffc0);
          StringPiece::StringPiece(&local_90,(char *)name_00,(long)pcVar9 - (long)pcVar7);
          bVar1 = StringPiece::empty(&local_50);
          if ((!bVar1) && (pcVar6 = StringPiece::operator[](&local_50,0), *pcVar6 == '^')) {
            iVar11 = -iVar11;
            StringPiece::remove_prefix(&local_50,1);
          }
          pUVar10 = LookupUnicodeGroup(name_00);
          if (pUVar10 == (UGroup *)0x0) {
            RegexpStatus::set_code(in_RCX,kRegexpBadCharRange);
            RegexpStatus::set_error_arg(in_RCX,(StringPiece *)&stack0xffffffffffffffc0);
            local_4 = kParseError;
          }
          else {
            AddUGroup((CharClassBuilder *)CONCAT44(iVar3,iVar11),(UGroup *)local_90.size_,
                      (int)((ulong)local_90.data_ >> 0x20),(ParseFlags)local_90.data_);
            local_4 = kParseOk;
          }
        }
      }
      else {
        local_4 = kParseNothing;
      }
    }
  }
  return local_4;
}

Assistant:

ParseStatus ParseUnicodeGroup(StringPiece* s, Regexp::ParseFlags parse_flags,
                              CharClassBuilder *cc,
                              RegexpStatus* status) {
  // Decide whether to parse.
  if (!(parse_flags & Regexp::UnicodeGroups))
    return kParseNothing;
  if (s->size() < 2 || (*s)[0] != '\\')
    return kParseNothing;
  Rune c = (*s)[1];
  if (c != 'p' && c != 'P')
    return kParseNothing;

  // Committed to parse.  Results:
  int sign = +1;  // -1 = negated char class
  if (c == 'P')
    sign = -sign;
  StringPiece seq = *s;  // \p{Han} or \pL
  StringPiece name;  // Han or L
  s->remove_prefix(2);  // '\\', 'p'

  if (!StringPieceToRune(&c, s, status))
    return kParseError;
  if (c != '{') {
    // Name is the bit of string we just skipped over for c.
    const char* p = seq.data() + 2;
    name = StringPiece(p, static_cast<size_t>(s->data() - p));
  } else {
    // Name is in braces. Look for closing }
    size_t end = s->find('}', 0);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(seq, status))
        return kParseError;
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(seq);
      return kParseError;
    }
    name = StringPiece(s->data(), end);  // without '}'
    s->remove_prefix(end + 1);  // with '}'
    if (!IsValidUTF8(name, status))
      return kParseError;
  }

  // Chop seq where s now begins.
  seq = StringPiece(seq.data(), static_cast<size_t>(s->data() - seq.data()));

  if (!name.empty() && name[0] == '^') {
    sign = -sign;
    name.remove_prefix(1);  // '^'
  }

#if !defined(RE2_USE_ICU)
  // Look up the group in the RE2 Unicode data.
  const UGroup *g = LookupUnicodeGroup(name);
  if (g == NULL) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  AddUGroup(cc, g, sign, parse_flags);
#else
  // Look up the group in the ICU Unicode data. Because ICU provides full
  // Unicode properties support, this could be more than a lookup by name.
  ::icu::UnicodeString ustr = ::icu::UnicodeString::fromUTF8(
      std::string("\\p{") + std::string(name) + std::string("}"));
  UErrorCode uerr = U_ZERO_ERROR;
  ::icu::UnicodeSet uset(ustr, uerr);
  if (U_FAILURE(uerr)) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  // Convert the UnicodeSet to a URange32 and UGroup that we can add.
  int nr = uset.getRangeCount();
  PODArray<URange32> r(nr);
  for (int i = 0; i < nr; i++) {
    r[i].lo = uset.getRangeStart(i);
    r[i].hi = uset.getRangeEnd(i);
  }
  UGroup g = {"", +1, 0, 0, r.data(), nr};
  AddUGroup(cc, &g, sign, parse_flags);
#endif

  return kParseOk;
}